

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O1

char * ngx_http_log_compile_format
                 (ngx_conf_t *cf,ngx_array_t *flushes,ngx_array_t *ops,ngx_array_t *args,
                 ngx_uint_t s)

{
  ulong uVar1;
  byte bVar2;
  void *pvVar3;
  ulong uVar4;
  ngx_http_log_op_run_pt p_Var5;
  u_char *__s2;
  ulong *puVar6;
  ngx_uint_t nVar7;
  int iVar8;
  size_t *psVar9;
  void *__dest;
  size_t sVar10;
  size_t sVar11;
  size_t *psVar12;
  char *pcVar13;
  code *pcVar14;
  code *pcVar15;
  ulong uVar16;
  ulong uVar17;
  ngx_str_t *__s1;
  ngx_http_log_var_t *pnVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  ngx_str_t local_60;
  ngx_array_t *local_50;
  ngx_conf_t *local_48;
  ulong local_40;
  ulong *local_38;
  
  pvVar3 = args->elts;
  bVar22 = true;
  nVar7 = s;
  local_50 = args;
  local_48 = cf;
  if (s < args->nelts) {
    pcVar13 = *(char **)((long)pvVar3 + s * 0x10 + 8);
    iVar8 = strncmp(pcVar13,"escape=",7);
    nVar7 = s;
    if (iVar8 == 0) {
      __s1 = (ngx_str_t *)(pcVar13 + 7);
      iVar8 = strcmp((char *)__s1,"json");
      bVar22 = iVar8 != 0;
      if ((bVar22) && (iVar8 = strcmp((char *)__s1,"default"), iVar8 != 0)) {
        pcVar13 = "unknown log format escaping \"%s\"";
LAB_00146598:
        ngx_conf_log_error(1,local_48,0,pcVar13,__s1);
        return (char *)0xffffffffffffffff;
      }
      nVar7 = s + 1;
    }
  }
  local_40 = nVar7;
  if (local_40 < local_50->nelts) {
    pcVar14 = ngx_http_log_json_variable_getlen;
    if (bVar22) {
      pcVar14 = ngx_http_log_variable_getlen;
    }
    pcVar15 = ngx_http_log_json_variable;
    if (bVar22) {
      pcVar15 = ngx_http_log_variable;
    }
    do {
      if (*(long *)((long)pvVar3 + local_40 * 0x10) != 0) {
        local_38 = (ulong *)(local_40 * 0x10 + (long)pvVar3);
        uVar19 = 0;
        do {
          puVar6 = local_38;
          psVar9 = (size_t *)ngx_array_push(ops);
          if (psVar9 == (size_t *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          uVar4 = puVar6[1];
          __s1 = (ngx_str_t *)(uVar4 + uVar19);
          if (*(char *)(uVar4 + uVar19) == '$') {
            uVar20 = uVar19 + 1;
            if (uVar20 != *puVar6) {
              pcVar13 = (char *)(uVar4 + uVar20);
              if (*pcVar13 == '{') {
                uVar20 = uVar19 + 2;
                if (uVar20 == *puVar6) goto LAB_00146579;
                bVar22 = true;
              }
              else {
                bVar22 = false;
              }
              local_60.data = (u_char *)(uVar4 + uVar20);
              __s2 = local_60.data;
              local_60.len = 0;
              if (uVar20 < *puVar6) {
                do {
                  bVar2 = *(byte *)(puVar6[1] + uVar20);
                  if ((*pcVar13 == '{') && (bVar2 == 0x7d)) {
                    uVar20 = uVar20 + 1;
                    bVar22 = false;
                    break;
                  }
                  if ((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) &&
                     (bVar2 != 0x5f && 9 < (byte)(bVar2 - 0x30))) break;
                  uVar20 = uVar20 + 1;
                  local_60.len = local_60.len + 1;
                } while (uVar20 < *puVar6);
              }
              sVar11 = local_60.len;
              if (bVar22) {
                pcVar13 = "the closing bracket in \"%V\" variable is missing";
                __s1 = &local_60;
                goto LAB_00146598;
              }
              if (local_60.len != 0) {
                sVar10 = 4;
                pnVar18 = ngx_http_log_vars;
                do {
                  pnVar18 = pnVar18 + 1;
                  if ((sVar10 == sVar11) &&
                     (iVar8 = strncmp((char *)pnVar18[-1].name.data,(char *)__s2,sVar11), iVar8 == 0
                     )) {
                    p_Var5 = pnVar18[-1].run;
                    *psVar9 = pnVar18[-1].len;
                    psVar9[1] = 0;
                    psVar9[2] = (size_t)p_Var5;
                    psVar9[3] = 0;
                    goto LAB_00146551;
                  }
                  sVar10 = (pnVar18->name).len;
                } while (sVar10 != 0);
                sVar11 = ngx_http_get_variable_index(local_48,&local_60);
                if (sVar11 == 0xffffffffffffffff) {
                  return (char *)0xffffffffffffffff;
                }
                *psVar9 = 0;
                psVar9[1] = (size_t)pcVar14;
                psVar9[2] = (size_t)pcVar15;
                psVar9[3] = sVar11;
                if (flushes != (ngx_array_t *)0x0) {
                  psVar12 = (size_t *)ngx_array_push(flushes);
                  if (psVar12 == (size_t *)0x0) {
                    return (char *)0xffffffffffffffff;
                  }
                  *psVar12 = psVar9[3];
                }
                goto LAB_00146551;
              }
            }
LAB_00146579:
            pcVar13 = "invalid parameter \"%s\"";
            goto LAB_00146598;
          }
          uVar21 = *puVar6;
          uVar17 = uVar19;
          uVar16 = uVar19 + 1;
          if (uVar19 + 1 < uVar21) {
            uVar16 = uVar21;
          }
          do {
            uVar1 = uVar17 + 1;
            uVar20 = uVar16;
            if (uVar21 <= uVar1) break;
            pcVar13 = (char *)(uVar4 + 1 + uVar17);
            uVar17 = uVar1;
            uVar20 = uVar1;
          } while (*pcVar13 != '$');
          uVar21 = uVar20 - uVar19;
          if (uVar21 != 0) {
            *psVar9 = uVar21;
            psVar9[1] = 0;
            if (uVar21 < 9) {
              psVar9[2] = (size_t)ngx_http_log_copy_short;
              psVar9[3] = 0;
              uVar17 = 0;
              uVar21 = uVar20;
              do {
                psVar9[3] = uVar17 << 8;
                uVar17 = uVar17 << 8 | (ulong)*(byte *)((uVar4 - 1) + uVar21);
                psVar9[3] = uVar17;
                uVar21 = uVar21 - 1;
              } while (uVar19 != uVar21);
            }
            else {
              psVar9[2] = (size_t)ngx_http_log_copy_long;
              __dest = ngx_pnalloc(local_48->pool,uVar21);
              if (__dest == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              memcpy(__dest,__s1,uVar21);
              psVar9[3] = (size_t)__dest;
            }
          }
LAB_00146551:
          uVar19 = uVar20;
        } while (uVar20 < *local_38);
      }
      local_40 = local_40 + 1;
    } while (local_40 < local_50->nelts);
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_log_compile_format(ngx_conf_t *cf, ngx_array_t *flushes,
    ngx_array_t *ops, ngx_array_t *args, ngx_uint_t s)
{
    u_char              *data, *p, ch;
    size_t               i, len;
    ngx_str_t           *value, var;
    ngx_int_t           *flush;
    ngx_uint_t           bracket, json;
    ngx_http_log_op_t   *op;
    ngx_http_log_var_t  *v;

    json = 0;
    value = args->elts;

    if (s < args->nelts && ngx_strncmp(value[s].data, "escape=", 7) == 0) {
        data = value[s].data + 7;

        if (ngx_strcmp(data, "json") == 0) {
            json = 1;

        } else if (ngx_strcmp(data, "default") != 0) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "unknown log format escaping \"%s\"", data);
            return NGX_CONF_ERROR;
        }

        s++;
    }

    for ( /* void */ ; s < args->nelts; s++) {

        i = 0;

        while (i < value[s].len) {

            op = ngx_array_push(ops);
            if (op == NULL) {
                return NGX_CONF_ERROR;
            }

            data = &value[s].data[i];

            if (value[s].data[i] == '$') {

                if (++i == value[s].len) {
                    goto invalid;
                }

                if (value[s].data[i] == '{') {
                    bracket = 1;

                    if (++i == value[s].len) {
                        goto invalid;
                    }

                    var.data = &value[s].data[i];

                } else {
                    bracket = 0;
                    var.data = &value[s].data[i];
                }

                for (var.len = 0; i < value[s].len; i++, var.len++) {
                    ch = value[s].data[i];

                    if (ch == '}' && bracket) {
                        i++;
                        bracket = 0;
                        break;
                    }

                    if ((ch >= 'A' && ch <= 'Z')
                        || (ch >= 'a' && ch <= 'z')
                        || (ch >= '0' && ch <= '9')
                        || ch == '_')
                    {
                        continue;
                    }

                    break;
                }

                if (bracket) {
                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                       "the closing bracket in \"%V\" "
                                       "variable is missing", &var);
                    return NGX_CONF_ERROR;
                }

                if (var.len == 0) {
                    goto invalid;
                }

                for (v = ngx_http_log_vars; v->name.len; v++) {

                    if (v->name.len == var.len
                        && ngx_strncmp(v->name.data, var.data, var.len) == 0)
                    {
                        op->len = v->len;
                        op->getlen = NULL;
                        op->run = v->run;
                        op->data = 0;

                        goto found;
                    }
                }

                if (ngx_http_log_variable_compile(cf, op, &var, json)
                    != NGX_OK)
                {
                    return NGX_CONF_ERROR;
                }

                if (flushes) {

                    flush = ngx_array_push(flushes);
                    if (flush == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    *flush = op->data; /* variable index */
                }

            found:

                continue;
            }

            i++;

            while (i < value[s].len && value[s].data[i] != '$') {
                i++;
            }

            len = &value[s].data[i] - data;

            if (len) {

                op->len = len;
                op->getlen = NULL;

                if (len <= sizeof(uintptr_t)) {
                    op->run = ngx_http_log_copy_short;
                    op->data = 0;

                    while (len--) {
                        op->data <<= 8;
                        op->data |= data[len];
                    }

                } else {
                    op->run = ngx_http_log_copy_long;

                    p = ngx_pnalloc(cf->pool, len);
                    if (p == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    ngx_memcpy(p, data, len);
                    op->data = (uintptr_t) p;
                }
            }
        }
    }

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid parameter \"%s\"", data);

    return NGX_CONF_ERROR;
}